

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_gej_add_var(secp256k1_gej *r,secp256k1_gej *a,secp256k1_gej *b,secp256k1_fe *rzr)

{
  secp256k1_fe *a_00;
  secp256k1_fe *a_01;
  int iVar1;
  long lVar2;
  secp256k1_fe local_218;
  secp256k1_fe t;
  secp256k1_fe s1;
  secp256k1_fe local_198;
  secp256k1_fe u1;
  secp256k1_fe z12;
  secp256k1_fe z22;
  secp256k1_fe u2;
  secp256k1_fe local_b8;
  secp256k1_fe s2;
  secp256k1_fe h3;
  
  if (a->infinity == 0) {
    if (b->infinity == 0) {
      a_00 = &b->z;
      secp256k1_fe_impl_sqr(&z22,a_00);
      a_01 = &a->z;
      secp256k1_fe_impl_sqr(&z12,a_01);
      secp256k1_fe_impl_mul(&u1,&a->x,&z22);
      secp256k1_fe_impl_mul(&u2,&b->x,&z12);
      secp256k1_fe_impl_mul(&s1,&a->y,&z22);
      secp256k1_fe_impl_mul(&s1,&s1,a_00);
      secp256k1_fe_impl_mul(&s2,&b->y,&z12);
      secp256k1_fe_impl_mul(&s2,&s2,a_01);
      local_198.n[0] = (u2.n[0] - u1.n[0]) + 0x3ffffbfffff0bc;
      local_198.n[1] = (u2.n[1] - u1.n[1]) + 0x3ffffffffffffc;
      local_198.n[2] = (u2.n[2] - u1.n[2]) + 0x3ffffffffffffc;
      local_198.n[3] = (u2.n[3] - u1.n[3]) + 0x3ffffffffffffc;
      local_198.n[4] = (u2.n[4] - u1.n[4]) + 0x3fffffffffffc;
      local_218.n[0] = (s1.n[0] - s2.n[0]) + 0x3ffffbfffff0bc;
      local_218.n[1] = (s1.n[1] - s2.n[1]) + 0x3ffffffffffffc;
      local_218.n[2] = (s1.n[2] - s2.n[2]) + 0x3ffffffffffffc;
      local_218.n[3] = (s1.n[3] - s2.n[3]) + 0x3ffffffffffffc;
      local_218.n[4] = (s1.n[4] - s2.n[4]) + 0x3fffffffffffc;
      iVar1 = secp256k1_fe_impl_normalizes_to_zero_var(&local_198);
      if (iVar1 == 0) {
        r->infinity = 0;
        secp256k1_fe_impl_mul(&t,&local_198,a_00);
        if (rzr != (secp256k1_fe *)0x0) {
          rzr->n[4] = t.n[4];
          rzr->n[2] = t.n[2];
          rzr->n[3] = t.n[3];
          rzr->n[0] = t.n[0];
          rzr->n[1] = t.n[1];
        }
        secp256k1_fe_impl_mul(&r->z,a_01,&t);
        secp256k1_fe_impl_sqr(&local_b8,&local_198);
        local_b8.n[0] = 0x3ffffbfffff0bc - local_b8.n[0];
        local_b8.n[1] = 0x3ffffffffffffc - local_b8.n[1];
        local_b8.n[2] = 0x3ffffffffffffc - local_b8.n[2];
        local_b8.n[3] = 0x3ffffffffffffc - local_b8.n[3];
        local_b8.n[4] = 0x3fffffffffffc - local_b8.n[4];
        secp256k1_fe_impl_mul(&h3,&local_b8,&local_198);
        secp256k1_fe_impl_mul(&t,&u1,&local_b8);
        secp256k1_fe_impl_sqr(&r->x,&local_218);
        secp256k1_fe_impl_add(&r->x,&h3);
        secp256k1_fe_impl_add(&r->x,&t);
        secp256k1_fe_impl_add(&r->x,&t);
        secp256k1_fe_impl_add(&t,&r->x);
        secp256k1_fe_impl_mul(&r->y,&t,&local_218);
        secp256k1_fe_impl_mul(&h3,&h3,&s1);
        secp256k1_fe_impl_add(&r->y,&h3);
        return;
      }
      iVar1 = secp256k1_fe_impl_normalizes_to_zero_var(&local_218);
      if (iVar1 == 0) {
        if (rzr != (secp256k1_fe *)0x0) {
          rzr->n[2] = 0;
          rzr->n[3] = 0;
          rzr->n[0] = 0;
          rzr->n[1] = 0;
          rzr->n[4] = 0;
        }
        r->infinity = 1;
        (r->x).n[0] = 0;
        (r->x).n[1] = 0;
        (r->x).n[2] = 0;
        (r->x).n[3] = 0;
        *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
        (r->y).n[1] = 0;
        (r->y).n[2] = 0;
        (r->y).n[3] = 0;
        (r->y).n[4] = 0;
        (r->z).n[0] = 0;
        (r->z).n[1] = 0;
        (r->z).n[2] = 0;
        (r->z).n[3] = 0;
        (r->z).n[4] = 0;
        return;
      }
      secp256k1_gej_double_var(r,a,rzr);
      return;
    }
    if (rzr != (secp256k1_fe *)0x0) {
      rzr->n[0] = 1;
      rzr->n[1] = 0;
      rzr->n[2] = 0;
      rzr->n[3] = 0;
      rzr->n[4] = 0;
    }
    lVar2 = 0x10;
  }
  else {
    lVar2 = 0x10;
    a = b;
  }
  for (; lVar2 != 0; lVar2 = lVar2 + -1) {
    (r->x).n[0] = (a->x).n[0];
    a = (secp256k1_gej *)((a->x).n + 1);
    r = (secp256k1_gej *)((r->x).n + 1);
  }
  return;
}

Assistant:

static void secp256k1_gej_add_var(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_gej *b, secp256k1_fe *rzr) {
    /* 12 mul, 4 sqr, 11 add/negate/normalizes_to_zero (ignoring special cases) */
    secp256k1_fe z22, z12, u1, u2, s1, s2, h, i, h2, h3, t;
    SECP256K1_GEJ_VERIFY(a);
    SECP256K1_GEJ_VERIFY(b);

    if (a->infinity) {
        VERIFY_CHECK(rzr == NULL);
        *r = *b;
        return;
    }
    if (b->infinity) {
        if (rzr != NULL) {
            secp256k1_fe_set_int(rzr, 1);
        }
        *r = *a;
        return;
    }

    secp256k1_fe_sqr(&z22, &b->z);
    secp256k1_fe_sqr(&z12, &a->z);
    secp256k1_fe_mul(&u1, &a->x, &z22);
    secp256k1_fe_mul(&u2, &b->x, &z12);
    secp256k1_fe_mul(&s1, &a->y, &z22); secp256k1_fe_mul(&s1, &s1, &b->z);
    secp256k1_fe_mul(&s2, &b->y, &z12); secp256k1_fe_mul(&s2, &s2, &a->z);
    secp256k1_fe_negate(&h, &u1, 1); secp256k1_fe_add(&h, &u2);
    secp256k1_fe_negate(&i, &s2, 1); secp256k1_fe_add(&i, &s1);
    if (secp256k1_fe_normalizes_to_zero_var(&h)) {
        if (secp256k1_fe_normalizes_to_zero_var(&i)) {
            secp256k1_gej_double_var(r, a, rzr);
        } else {
            if (rzr != NULL) {
                secp256k1_fe_set_int(rzr, 0);
            }
            secp256k1_gej_set_infinity(r);
        }
        return;
    }

    r->infinity = 0;
    secp256k1_fe_mul(&t, &h, &b->z);
    if (rzr != NULL) {
        *rzr = t;
    }
    secp256k1_fe_mul(&r->z, &a->z, &t);

    secp256k1_fe_sqr(&h2, &h);
    secp256k1_fe_negate(&h2, &h2, 1);
    secp256k1_fe_mul(&h3, &h2, &h);
    secp256k1_fe_mul(&t, &u1, &h2);

    secp256k1_fe_sqr(&r->x, &i);
    secp256k1_fe_add(&r->x, &h3);
    secp256k1_fe_add(&r->x, &t);
    secp256k1_fe_add(&r->x, &t);

    secp256k1_fe_add(&t, &r->x);
    secp256k1_fe_mul(&r->y, &t, &i);
    secp256k1_fe_mul(&h3, &h3, &s1);
    secp256k1_fe_add(&r->y, &h3);

    SECP256K1_GEJ_VERIFY(r);
}